

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::Session::showHelp(Session *this)

{
  ostream *poVar1;
  Parser *parser;
  ostream *in_RDI;
  
  poVar1 = cout();
  parser = (Parser *)std::operator<<(poVar1,"\nCatch2 v");
  libraryVersion();
  poVar1 = Catch::operator<<(in_RDI,(Version *)parser);
  std::operator<<(poVar1,'\n');
  poVar1 = Clara::operator<<(in_RDI,parser);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,"For more detailed usage please see the project docs\n\n");
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

void Session::showHelp() const {
        Catch::cout()
                << "\nCatch2 v" << libraryVersion() << '\n'
                << m_cli << '\n'
                << "For more detailed usage please see the project docs\n\n" << std::flush;
    }